

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinc_resampler_sse.cc
# Opt level: O3

float webrtc::SincResampler::Convolve_SSE
                (float *input_ptr,float *k1,float *k2,double kernel_interpolation_factor)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  fVar6 = 0.0;
  fVar7 = 0.0;
  fVar8 = 0.0;
  fVar9 = 0.0;
  uVar4 = 0xfffffffffffffffc;
  fVar10 = 0.0;
  fVar11 = 0.0;
  fVar12 = 0.0;
  fVar13 = 0.0;
  fVar5 = 0.0;
  fVar14 = 0.0;
  if (((ulong)input_ptr & 0xf) == 0) {
    do {
      pfVar1 = input_ptr + uVar4 + 4;
      pfVar2 = k1 + uVar4 + 4;
      pfVar3 = k2 + uVar4 + 4;
      fVar10 = fVar10 + *pfVar2 * *pfVar1;
      fVar11 = fVar11 + pfVar2[1] * pfVar1[1];
      fVar12 = fVar12 + pfVar2[2] * pfVar1[2];
      fVar13 = fVar13 + pfVar2[3] * pfVar1[3];
      fVar6 = fVar5 + *pfVar1 * *pfVar3;
      fVar7 = fVar7 + pfVar1[1] * pfVar3[1];
      fVar8 = fVar14 + pfVar1[2] * pfVar3[2];
      fVar9 = fVar9 + pfVar1[3] * pfVar3[3];
      uVar4 = uVar4 + 4;
      fVar5 = fVar6;
      fVar14 = fVar8;
    } while (uVar4 < 0x1c);
  }
  else {
    do {
      pfVar1 = input_ptr + uVar4 + 4;
      pfVar2 = k1 + uVar4 + 4;
      pfVar3 = k2 + uVar4 + 4;
      fVar10 = fVar10 + *pfVar2 * *pfVar1;
      fVar11 = fVar11 + pfVar2[1] * pfVar1[1];
      fVar12 = fVar12 + pfVar2[2] * pfVar1[2];
      fVar13 = fVar13 + pfVar2[3] * pfVar1[3];
      fVar6 = fVar6 + *pfVar1 * *pfVar3;
      fVar7 = fVar7 + pfVar1[1] * pfVar3[1];
      fVar8 = fVar8 + pfVar1[2] * pfVar3[2];
      fVar9 = fVar9 + pfVar1[3] * pfVar3[3];
      uVar4 = uVar4 + 4;
    } while (uVar4 < 0x1c);
  }
  fVar14 = (float)(1.0 - kernel_interpolation_factor);
  fVar5 = (float)kernel_interpolation_factor;
  return fVar5 * fVar9 + fVar14 * fVar13 + fVar5 * fVar7 + fVar14 * fVar11 +
         fVar5 * fVar8 + fVar14 * fVar12 + fVar5 * fVar6 + fVar14 * fVar10;
}

Assistant:

float SincResampler::Convolve_SSE(const float* input_ptr, const float* k1,
                                  const float* k2,
                                  double kernel_interpolation_factor) {
  __m128 m_input;
  __m128 m_sums1 = _mm_setzero_ps();
  __m128 m_sums2 = _mm_setzero_ps();

  // Based on |input_ptr| alignment, we need to use loadu or load.  Unrolling
  // these loops hurt performance in local testing.
  if (reinterpret_cast<uintptr_t>(input_ptr) & 0x0F) {
    for (size_t i = 0; i < kKernelSize; i += 4) {
      m_input = _mm_loadu_ps(input_ptr + i);
      m_sums1 = _mm_add_ps(m_sums1, _mm_mul_ps(m_input, _mm_load_ps(k1 + i)));
      m_sums2 = _mm_add_ps(m_sums2, _mm_mul_ps(m_input, _mm_load_ps(k2 + i)));
    }
  } else {
    for (size_t i = 0; i < kKernelSize; i += 4) {
      m_input = _mm_load_ps(input_ptr + i);
      m_sums1 = _mm_add_ps(m_sums1, _mm_mul_ps(m_input, _mm_load_ps(k1 + i)));
      m_sums2 = _mm_add_ps(m_sums2, _mm_mul_ps(m_input, _mm_load_ps(k2 + i)));
    }
  }

  // Linearly interpolate the two "convolutions".
  m_sums1 = _mm_mul_ps(m_sums1, _mm_set_ps1(
      static_cast<float>(1.0 - kernel_interpolation_factor)));
  m_sums2 = _mm_mul_ps(m_sums2, _mm_set_ps1(
      static_cast<float>(kernel_interpolation_factor)));
  m_sums1 = _mm_add_ps(m_sums1, m_sums2);

  // Sum components together.
  float result;
  m_sums2 = _mm_add_ps(_mm_movehl_ps(m_sums1, m_sums1), m_sums1);
  _mm_store_ss(&result, _mm_add_ss(m_sums2, _mm_shuffle_ps(
      m_sums2, m_sums2, 1)));

  return result;
}